

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBaseRunner.cpp
# Opt level: O2

int __thiscall xmrig::OclBaseRunner::init(OclBaseRunner *this,EVP_PKEY_CTX *ctx)

{
  cl_context context;
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  cl_command_queue p_Var3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  OclSharedData *this_00;
  cl_mem p_Var4;
  ulong uVar5;
  ulong size;
  
  context = this->m_ctx;
  iVar2 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])();
  p_Var3 = OclLib::createCommandQueue
                     (context,*(cl_device_id *)(CONCAT44(extraout_var,iVar2) + 0x20));
  this->m_queue = p_Var3;
  iVar2 = (*(this->super_IOclRunner)._vptr_IOclRunner[0xe])(this);
  size = ((CONCAT44(extraout_var_00,iVar2) - 1U) / this->m_align + 1) * this->m_align;
  if (size < 0x40000000) {
    iVar2 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])(this);
    if (*(int *)(CONCAT44(extraout_var_01,iVar2) + 0x78) == 1) {
      iVar2 = (*(this->super_IOclRunner)._vptr_IOclRunner[6])(this);
      uVar5 = *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 0x60);
      uVar1 = *(ulong *)(CONCAT44(extraout_var_02,iVar2) + 0x68);
      if (uVar1 < uVar5) {
        uVar5 = uVar1;
      }
      if (0x3fffffff < uVar5) {
        (*(this->super_IOclRunner)._vptr_IOclRunner[6])(this);
        this_00 = OclSharedState::get(0);
        p_Var4 = OclSharedData::createBuffer(this_00,this->m_ctx,size,&this->m_offset);
        goto LAB_0016faec;
      }
    }
  }
  p_Var4 = OclLib::createBuffer(this->m_ctx,1,size,(void *)0x0);
LAB_0016faec:
  this->m_buffer = p_Var4;
  p_Var4 = createSubBuffer(this,0x84,0x80);
  this->m_input = p_Var4;
  p_Var4 = createSubBuffer(this,1,0x400);
  this->m_output = p_Var4;
  return (int)p_Var4;
}

Assistant:

void xmrig::OclBaseRunner::init()
{
    m_queue = OclLib::createCommandQueue(m_ctx, data().device.id());

    size_t size = align(bufferSize());

    if (size < oneGiB && data().device.vendorId() == OCL_VENDOR_AMD && data().device.freeMemSize() >= oneGiB) {
        m_buffer = OclSharedState::get(data().device.index()).createBuffer(m_ctx, size, m_offset);
    }
    else {
        m_buffer = OclLib::createBuffer(m_ctx, CL_MEM_READ_WRITE, size);
    }

    m_input  = createSubBuffer(CL_MEM_READ_ONLY | CL_MEM_HOST_WRITE_ONLY, Job::kMaxBlobSize);
    m_output = createSubBuffer(CL_MEM_READ_WRITE, sizeof(cl_uint) * 0x100);
}